

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threads.h
# Opt level: O2

void __thiscall Threadpool<Searchthread>::wait_finished(Threadpool<Searchthread> *this)

{
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> local_20;
  
  std::unique_lock<std::mutex>::unique_lock(&local_20,&this->m);
  std::condition_variable::wait<Threadpool<Searchthread>::wait_finished()::_lambda()_1_>
            (&this->cv_finished,&local_20,(anon_class_8_1_8991fb9c)this);
  std::unique_lock<std::mutex>::~unique_lock(&local_20);
  return;
}

Assistant:

void wait_finished() {
		std::unique_lock<std::mutex> lock(m);
		cv_finished.wait(lock, [this]() { return tasks.empty() && (busy == 0); });
	}